

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_options(archive_write *a,char *key,char *value)

{
  long lVar1;
  int iVar2;
  void *_p;
  char *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int num;
  uint32_t seg;
  int r;
  char *p;
  iso9660_conflict *iso9660;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  undefined2 uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffcc;
  char *local_30;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  _p = (void *)(ulong)((int)*in_RSI - 0x61);
  switch(_p) {
  case (void *)0x0:
    iVar2 = strcmp(in_RSI,"abstract-file");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffffffe | (uint)(iVar2 == 0);
      return iVar2;
    }
    iVar2 = strcmp(in_RSI,"application-id");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffffffd | (uint)(iVar2 == 0) << 1
      ;
      return iVar2;
    }
    iVar2 = strcmp(in_RSI,"allow-vernum");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xfffffffb | (uint)(in_RDX != (char *)0x0) << 2;
      return 0;
    }
    break;
  case (void *)0x1:
    iVar2 = strcmp(in_RSI,"biblio-file");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffffff7 | (uint)(iVar2 == 0) << 3
      ;
      return iVar2;
    }
    iVar2 = strcmp(in_RSI,"boot");
    if (iVar2 == 0) {
      if (in_RDX == (char *)0x0) {
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xffffffef;
      }
      else {
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xffffffef | 0x10;
        *(undefined8 *)(lVar1 + 0x10330) = 0;
        if (in_RDX != (char *)0x0) {
          strlen(in_RDX);
        }
        archive_strncat((archive_string *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),_p,
                        (size_t)in_RDX);
      }
      return 0;
    }
    iVar2 = strcmp(in_RSI,"boot-catalog");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xffffffdf | (uint)(iVar2 == 0) << 5
      ;
      return iVar2;
    }
    iVar2 = strcmp(in_RSI,"boot-info-table");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xffffffbf | (uint)(in_RDX != (char *)0x0) << 6;
      return 0;
    }
    iVar2 = strcmp(in_RSI,"boot-load-seg");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xffffff7f;
      if (in_RDX != (char *)0x0) {
        uVar4 = 0;
        local_30 = in_RDX;
        if ((*in_RDX == '0') && ((in_RDX[1] == 'x' || (in_RDX[1] == 'X')))) {
          local_30 = in_RDX + 2;
        }
        do {
          if (*local_30 == '\0') {
            *(short *)(lVar1 + 0x1036a) = (short)uVar4;
            *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xffffff7f | 0x80;
            return 0;
          }
          if (uVar4 != 0) {
            uVar4 = uVar4 << 4;
          }
          if ((*local_30 < 'A') || ('F' < *local_30)) {
            if ((*local_30 < 'a') || ('f' < *local_30)) {
              if ((*local_30 < '0') || ('9' < *local_30)) break;
              iVar2 = *local_30 + -0x30;
            }
            else {
              iVar2 = *local_30 + -0x57;
            }
          }
          else {
            iVar2 = *local_30 + -0x37;
          }
          uVar4 = iVar2 + uVar4;
          if (0xffff < uVar4) {
            archive_set_error(in_RDI,-1,"Invalid value(over 0xffff) for option ``%s\'\'",in_RSI);
            return -0x1e;
          }
          local_30 = local_30 + 1;
        } while( true );
      }
    }
    else {
      iVar2 = strcmp(in_RSI,"boot-load-size");
      if (iVar2 == 0) {
        uVar3 = 0;
        iVar2 = get_num_opt((archive_write *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (int *)(ulong)in_stack_ffffffffffffffc0,(int)((ulong)_p >> 0x20),(int)_p
                            ,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        *(uint *)(lVar1 + 0x10370) =
             *(uint *)(lVar1 + 0x10370) & 0xfffffeff | (uint)(iVar2 == 0) << 8;
        if (iVar2 == 0) {
          *(undefined2 *)(lVar1 + 0x1036c) = uVar3;
          return 0;
        }
        return -0x1e;
      }
      iVar2 = strcmp(in_RSI,"boot-type");
      if (iVar2 != 0) {
        return -0x14;
      }
      if (in_RDX != (char *)0x0) {
        iVar2 = strcmp(in_RDX,"no-emulation");
        if (iVar2 == 0) {
          *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffff9ff | 0x200;
        }
        else {
          iVar2 = strcmp(in_RDX,"fd");
          if (iVar2 == 0) {
            *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffff9ff | 0x400;
          }
          else {
            iVar2 = strcmp(in_RDX,"hard-disk");
            if (iVar2 != 0) goto LAB_0029cde8;
            *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffff9ff | 0x600;
          }
        }
        return 0;
      }
    }
LAB_0029cde8:
    archive_set_error(in_RDI,-1,"Invalid value for option ``%s\'\'",in_RSI);
    return -0x19;
  case (void *)0x2:
    iVar2 = strcmp(in_RSI,"compression-level");
    if (iVar2 == 0) {
      if (((in_RDX != (char *)0x0) && ('/' < *in_RDX)) && ((*in_RDX < ':' && (in_RDX[1] == '\0'))))
      {
        *(int *)(lVar1 + 0x2c8) = *in_RDX + -0x30;
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfffff7ff | 0x800;
        return 0;
      }
      goto LAB_0029cde8;
    }
    iVar2 = strcmp(in_RSI,"copyright-file");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xffffefff | (uint)(iVar2 == 0) << 0xc;
      return iVar2;
    }
    break;
  case (void *)0x8:
    iVar2 = strcmp(in_RSI,"iso-level");
    if (iVar2 == 0) {
      if ((((in_RDX != (char *)0x0) && (in_RDX[1] == '\0')) && ('0' < *in_RDX)) && (*in_RDX < '5'))
      {
        *(uint *)(lVar1 + 0x10370) =
             *(uint *)(lVar1 + 0x10370) & 0xfffe3fff | ((int)*in_RDX - 0x30U & 7) << 0xe;
        return 0;
      }
      goto LAB_0029cde8;
    }
    break;
  case (void *)0x9:
    iVar2 = strcmp(in_RSI,"joliet");
    if (iVar2 == 0) {
      if (in_RDX == (char *)0x0) {
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfff9ffff;
      }
      else {
        iVar2 = strcmp(in_RDX,"1");
        if (iVar2 == 0) {
          *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfff9ffff | 0x20000;
        }
        else {
          iVar2 = strcmp(in_RDX,"long");
          if (iVar2 != 0) goto LAB_0029cde8;
          *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfff9ffff | 0x40000;
        }
      }
      return 0;
    }
    break;
  case (void *)0xb:
    iVar2 = strcmp(in_RSI,"limit-depth");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xfff7ffff | (uint)(in_RDX != (char *)0x0) << 0x13;
      return 0;
    }
    iVar2 = strcmp(in_RSI,"limit-dirs");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xffefffff | (uint)(in_RDX != (char *)0x0) << 0x14;
      return 0;
    }
    break;
  case (void *)0xf:
    iVar2 = strcmp(in_RSI,"pad");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xffdfffff | (uint)(in_RDX != (char *)0x0) << 0x15;
      return 0;
    }
    iVar2 = strcmp(in_RSI,"publisher");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xffbfffff | (uint)(iVar2 == 0) << 0x16;
      return iVar2;
    }
    break;
  case (void *)0x11:
    iVar2 = strcmp(in_RSI,"rockridge");
    if ((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"Rockridge"), iVar2 == 0)) {
      if (in_RDX == (char *)0x0) {
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfe7fffff;
      }
      else {
        iVar2 = strcmp(in_RDX,"1");
        if (iVar2 == 0) {
          *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfe7fffff | 0x1000000;
        }
        else {
          iVar2 = strcmp(in_RDX,"strict");
          if (iVar2 == 0) {
            *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfe7fffff | 0x800000;
          }
          else {
            iVar2 = strcmp(in_RDX,"useful");
            if (iVar2 != 0) goto LAB_0029cde8;
            *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfe7fffff | 0x1000000;
          }
        }
      }
      return 0;
    }
    break;
  case (void *)0x15:
    iVar2 = strcmp(in_RSI,"volume-id");
    if (iVar2 == 0) {
      iVar2 = get_str_opt((archive_write *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (archive_string *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)_p,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *(uint *)(lVar1 + 0x10370) =
           *(uint *)(lVar1 + 0x10370) & 0xfdffffff | (uint)(iVar2 == 0) << 0x19;
      return iVar2;
    }
    break;
  case (void *)0x19:
    iVar2 = strcmp(in_RSI,"zisofs");
    if (iVar2 == 0) {
      if (in_RDX == (char *)0x0) {
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfbffffff;
      }
      else {
        *(uint *)(lVar1 + 0x10370) = *(uint *)(lVar1 + 0x10370) & 0xfbffffff | 0x4000000;
      }
      return 0;
    }
  }
  return -0x14;
}

Assistant:

static int
iso9660_options(struct archive_write *a, const char *key, const char *value)
{
	struct iso9660 *iso9660 = a->format_data;
	const char *p;
	int r;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "abstract-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->abstract_file_identifier),
			    ABSTRACT_FILE_SIZE, key, value);
			iso9660->opt.abstract_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "application-id") == 0) {
			r = get_str_opt(a,
			    &(iso9660->application_identifier),
			    APPLICATION_IDENTIFIER_SIZE, key, value);
			iso9660->opt.application_id = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "allow-vernum") == 0) {
			iso9660->opt.allow_vernum = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'b':
		if (strcmp(key, "biblio-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->bibliographic_file_identifier),
			    BIBLIO_FILE_SIZE, key, value);
			iso9660->opt.biblio_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot") == 0) {
			if (value == NULL)
				iso9660->opt.boot = 0;
			else {
				iso9660->opt.boot = 1;
				archive_strcpy(
				    &(iso9660->el_torito.boot_filename),
				    value);
			}
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-catalog") == 0) {
			r = get_str_opt(a,
			    &(iso9660->el_torito.catalog_filename),
			    1024, key, value);
			iso9660->opt.boot_catalog = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot-info-table") == 0) {
			iso9660->opt.boot_info_table = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-seg") == 0) {
			uint32_t seg;

			iso9660->opt.boot_load_seg = 0;
			if (value == NULL)
				goto invalid_value;
			seg = 0;
			p = value;
			if (p[0] == '0' && (p[1] == 'x' || p[1] == 'X'))
				p += 2;
			while (*p) {
				if (seg)
					seg <<= 4;
				if (*p >= 'A' && *p <= 'F')
					seg += *p - 'A' + 0x0a;
				else if (*p >= 'a' && *p <= 'f')
					seg += *p - 'a' + 0x0a;
				else if (*p >= '0' && *p <= '9')
					seg += *p - '0';
				else
					goto invalid_value;
				if (seg > 0xffff) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Invalid value(over 0xffff) for "
					    "option ``%s''", key);
					return (ARCHIVE_FATAL);
				}
				p++;
			}
			iso9660->el_torito.boot_load_seg = (uint16_t)seg;
			iso9660->opt.boot_load_seg = 1;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-size") == 0) {
			int num = 0;
			r = get_num_opt(a, &num, 0xffff, 1, key, value);
			iso9660->opt.boot_load_size = r == ARCHIVE_OK;
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->el_torito.boot_load_size = (uint16_t)num;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-type") == 0) {
			if (value == NULL)
				goto invalid_value;
			if (strcmp(value, "no-emulation") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_NO_EMU;
			else if (strcmp(value, "fd") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_FD;
			else if (strcmp(value, "hard-disk") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_HARD_DISK;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'c':
		if (strcmp(key, "compression-level") == 0) {
#ifdef HAVE_ZLIB_H
			if (value == NULL ||
			    !(value[0] >= '0' && value[0] <= '9') ||
			    value[1] != '\0')
				goto invalid_value;
                	iso9660->zisofs.compression_level = value[0] - '0';
			iso9660->opt.compression_level = 1;
                	return (ARCHIVE_OK);
#else
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Option ``%s'' "
			    "is not supported on this platform.", key);
			return (ARCHIVE_FATAL);
#endif
		}
		if (strcmp(key, "copyright-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->copyright_file_identifier),
			    COPYRIGHT_FILE_SIZE, key, value);
			iso9660->opt.copyright_file = r == ARCHIVE_OK;
			return (r);
		}
#ifdef DEBUG
		/* Specifies Volume creation date and time;
		 * year(4),month(2),day(2),hour(2),minute(2),second(2).
		 * e.g. "20090929033757"
		 */
		if (strcmp(key, "creation") == 0) {
			struct tm tm;
			char buf[5];

			p = value;
			if (p == NULL || strlen(p) < 14)
				goto invalid_value;
			memset(&tm, 0, sizeof(tm));
			memcpy(buf, p, 4); buf[4] = '\0'; p += 4;
			tm.tm_year = strtol(buf, NULL, 10) - 1900;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mon = strtol(buf, NULL, 10) - 1;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mday = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_hour = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_min = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0';
			tm.tm_sec = strtol(buf, NULL, 10);
			iso9660->birth_time = mktime(&tm);
			return (ARCHIVE_OK);
		}
#endif
		break;
	case 'i':
		if (strcmp(key, "iso-level") == 0) {
			if (value != NULL && value[1] == '\0' &&
			    (value[0] >= '1' && value[0] <= '4')) {
				iso9660->opt.iso_level = value[0]-'0';
				return (ARCHIVE_OK);
			}
			goto invalid_value;
		}
		break;
	case 'j':
		if (strcmp(key, "joliet") == 0) {
			if (value == NULL)
				iso9660->opt.joliet = OPT_JOLIET_DISABLE;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.joliet = OPT_JOLIET_ENABLE;
			else if (strcmp(value, "long") == 0)
				iso9660->opt.joliet = OPT_JOLIET_LONGNAME;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'l':
		if (strcmp(key, "limit-depth") == 0) {
			iso9660->opt.limit_depth = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "limit-dirs") == 0) {
			iso9660->opt.limit_dirs = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'p':
		if (strcmp(key, "pad") == 0) {
			iso9660->opt.pad = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "publisher") == 0) {
			r = get_str_opt(a,
			    &(iso9660->publisher_identifier),
			    PUBLISHER_IDENTIFIER_SIZE, key, value);
			iso9660->opt.publisher = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'r':
		if (strcmp(key, "rockridge") == 0 ||
		    strcmp(key, "Rockridge") == 0) {
			if (value == NULL)
				iso9660->opt.rr = OPT_RR_DISABLED;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else if (strcmp(value, "strict") == 0)
				iso9660->opt.rr = OPT_RR_STRICT;
			else if (strcmp(value, "useful") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'v':
		if (strcmp(key, "volume-id") == 0) {
			r = get_str_opt(a, &(iso9660->volume_identifier),
			    VOLUME_IDENTIFIER_SIZE, key, value);
			iso9660->opt.volume_id = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'z':
		if (strcmp(key, "zisofs") == 0) {
			if (value == NULL)
				iso9660->opt.zisofs = OPT_ZISOFS_DISABLED;
			else {
#ifdef HAVE_ZLIB_H
				iso9660->opt.zisofs = OPT_ZISOFS_DIRECT;
#else
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "``zisofs'' "
				    "is not supported on this platform.");
				return (ARCHIVE_FATAL);
#endif
			}
			return (ARCHIVE_OK);
		}
		break;
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);

invalid_value:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Invalid value for option ``%s''", key);
	return (ARCHIVE_FAILED);
}